

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrppm.c
# Opt level: O3

void start_output_ppm(j_decompress_ptr cinfo,djpeg_dest_ptr dinfo)

{
  J_COLOR_SPACE JVar1;
  uint uVar2;
  uint uVar3;
  jpeg_error_mgr *pjVar4;
  char *__format;
  FILE *__stream;
  
  JVar1 = cinfo->out_color_space;
  if ((JVar1 - JCS_EXT_RGB < 10) || (JVar1 == JCS_CMYK)) {
    if ((JVar1 < JCS_EXT_RGB) && (cinfo->quantize_colors != 0)) {
      pjVar4 = cinfo->err;
      pjVar4->msg_code = 0x404;
      (*pjVar4->error_exit)((j_common_ptr)cinfo);
    }
  }
  else if (JVar1 != JCS_RGB) {
    if (JVar1 != JCS_GRAYSCALE) {
      pjVar4 = cinfo->err;
      pjVar4->msg_code = 0x404;
      (*pjVar4->error_exit)((j_common_ptr)cinfo);
      return;
    }
    __stream = (FILE *)dinfo->output_file;
    uVar2 = cinfo->output_width;
    uVar3 = cinfo->output_height;
    __format = "P5\n%ld %ld\n%d\n";
    goto LAB_0010824f;
  }
  __stream = (FILE *)dinfo->output_file;
  uVar2 = cinfo->output_width;
  uVar3 = cinfo->output_height;
  __format = "P6\n%ld %ld\n%d\n";
LAB_0010824f:
  fprintf(__stream,__format,(ulong)uVar2,(ulong)uVar3,0xff);
  return;
}

Assistant:

METHODDEF(void)
start_output_ppm(j_decompress_ptr cinfo, djpeg_dest_ptr dinfo)
{
  ppm_dest_ptr dest = (ppm_dest_ptr)dinfo;

  /* Emit file header */
  switch (cinfo->out_color_space) {
  case JCS_GRAYSCALE:
    /* emit header for raw PGM format */
    fprintf(dest->pub.output_file, "P5\n%ld %ld\n%d\n",
            (long)cinfo->output_width, (long)cinfo->output_height, PPM_MAXVAL);
    break;
  case JCS_RGB:
  case JCS_EXT_RGB:
  case JCS_EXT_RGBX:
  case JCS_EXT_BGR:
  case JCS_EXT_BGRX:
  case JCS_EXT_XBGR:
  case JCS_EXT_XRGB:
  case JCS_EXT_RGBA:
  case JCS_EXT_BGRA:
  case JCS_EXT_ABGR:
  case JCS_EXT_ARGB:
  case JCS_CMYK:
    if (!IsExtRGB(cinfo->out_color_space) && cinfo->quantize_colors)
      ERREXIT(cinfo, JERR_PPM_COLORSPACE);
    /* emit header for raw PPM format */
    fprintf(dest->pub.output_file, "P6\n%ld %ld\n%d\n",
            (long)cinfo->output_width, (long)cinfo->output_height, PPM_MAXVAL);
    break;
  default:
    ERREXIT(cinfo, JERR_PPM_COLORSPACE);
  }
}